

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void spirv_cross::inner::
     join_helper<char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
               (StringStream<4096UL,_4096UL> *stream,char (*t) [9],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               char (*ts_1) [17],uint *ts_2,char (*ts_3) [9],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,
               char (*ts_5) [69])

{
  char (*ts_local_3) [9];
  uint *ts_local_2;
  char (*ts_local_1) [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  char (*t_local) [9];
  StringStream<4096UL,_4096UL> *stream_local;
  
  StringStream<4096UL,_4096UL>::operator<<(stream,*t);
  join_helper<std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
            (stream,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}